

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::iterate(AtomicCounterTest *this)

{
  OffsetType OVar1;
  BindingType BVar2;
  uint uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  RenderContext *renderCtx;
  pointer puVar4;
  char cVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar8;
  undefined4 extraout_var_01;
  ostream *poVar9;
  void *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__dest;
  TestError *pTVar11;
  Operation OVar12;
  long lVar13;
  uint *puVar14;
  uint uVar15;
  byte bVar16;
  int iVar17;
  qpTestResult testResult;
  char *pcVar18;
  uint uVar19;
  int iVar20;
  undefined4 uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  bool bVar25;
  ScopedLogSection counterSection;
  size_type __dnew;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counters;
  vector<unsigned_int,_std::allocator<unsigned_int>_> gets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  Buffer outputBuffer;
  Buffer counterBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrements;
  ShaderProgram program;
  int local_470;
  int local_460;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_428;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e8;
  undefined1 local_3c8 [16];
  pointer local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  undefined4 local_39c;
  undefined1 local_398 [8];
  pointer puStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388 [6];
  ios_base local_328 [8];
  ios_base local_320 [272];
  ulong local_210;
  ObjectWrapper local_208;
  ObjectWrapper local_1f0;
  undefined1 local_1d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [40];
  ShaderProgram local_100;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar6);
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1f0,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar8);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_208,(Functions *)CONCAT44(extraout_var_01,iVar6),pOVar8);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  memset(local_1d8,0,0xac);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  bVar25 = (this->m_spec).bindingType == BINDINGTYPE_INVALID_DEFAULT;
  if (bVar25) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"layout(binding=10000",0x14);
  }
  OVar1 = (this->m_spec).offsetType;
  if (OVar1 == OFFSETTYPE_INVALID_DEFAULT) {
    pcVar18 = "layout(binding=1, ";
    if (bVar25) {
      pcVar18 = ", ";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,pcVar18,(ulong)!bVar25 << 4 | 2);
    pcVar18 = "offset=1";
LAB_00401b28:
    bVar25 = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,pcVar18,8);
  }
  else if (OVar1 == OFFSETTYPE_RESET_DEFAULT) {
    pcVar18 = "layout(binding=1, ";
    if (bVar25) {
      pcVar18 = ", ";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,pcVar18,(ulong)!bVar25 << 4 | 2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
    bVar25 = true;
    std::ostream::operator<<(local_398,((this->m_spec).atomicCounterCount << 2) >> 1);
  }
  else if (OVar1 == OFFSETTYPE_DEFAULT_AUTO) {
    pcVar18 = "layout(binding=1, ";
    if (bVar25) {
      pcVar18 = ", ";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,pcVar18,(ulong)!bVar25 << 4 | 2);
    pcVar18 = "offset=4";
    goto LAB_00401b28;
  }
  if (bVar25) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,") uniform atomic_uint;\n",0x17);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,"layout(binding = 1, std430) buffer Output {\n",0x2c);
  OVar12 = (this->m_spec).operations;
  if (OVar12 != OPERATION_GET && (OVar12 & OPERATION_GET) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\tuint preGet[",0xd);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (local_398,
                        (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                        (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  }
  if (((this->m_spec).operations & OPERATION_INC) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"\tuint increment[",0x10);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (local_398,
                        (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                        (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  }
  if (((this->m_spec).operations & OPERATION_DEC) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"\tuint decrement[",0x10);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (local_398,
                        (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                        (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  }
  OVar12 = (this->m_spec).operations;
  if (OVar12 != OPERATION_GET && (OVar12 & OPERATION_GET) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\tuint postGet[",0xe);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (local_398,
                        (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                        (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  }
  if ((this->m_spec).operations == OPERATION_GET) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\tuint get[",10);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (local_398,
                        (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                        (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"} sb_in;\n\n",10);
  iVar6 = (this->m_spec).atomicCounterCount;
  if (0 < iVar6) {
    iVar17 = 0;
    iVar24 = 1;
    local_460 = -1;
    uVar19 = 0;
    do {
      if ((uVar19 == iVar6 / 2) && ((this->m_spec).offsetType == OFFSETTYPE_RESET_DEFAULT)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"layout(binding=1, offset=0) uniform atomic_uint;\n",0x31);
      }
      BVar2 = (this->m_spec).bindingType;
      if (BVar2 == BINDINGTYPE_BASIC) {
        lVar13 = 0x10;
        pcVar18 = "layout(binding=1";
LAB_00401dbe:
        bVar16 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,pcVar18,lVar13);
      }
      else {
        if (BVar2 == BINDINGTYPE_INVALID) {
          lVar13 = 0x14;
          pcVar18 = "layout(binding=10000";
          goto LAB_00401dbe;
        }
        bVar16 = 0;
      }
      uVar15 = uVar19;
      switch((this->m_spec).offsetType) {
      case OFFSETTYPE_NONE:
      case OFFSETTYPE_INVALID_DEFAULT:
        lVar13 = 0x1b;
        pcVar18 = "uniform atomic_uint counter";
        if (bVar16 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
          pcVar18 = "uniform atomic_uint counter";
        }
        goto LAB_00402107;
      case OFFSETTYPE_BASIC:
        pcVar18 = "layout(";
        if (bVar16 != 0) {
          pcVar18 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar18,(ulong)(bVar16 ^ 1) * 5 + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
        poVar9 = (ostream *)std::ostream::operator<<(local_398,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,") uniform atomic_uint counter",0x1d);
        break;
      case OFFSETTYPE_REVERSE:
        pcVar18 = "layout(";
        if (bVar16 != 0) {
          pcVar18 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar18,(ulong)(bVar16 ^ 1) * 5 + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
        poVar9 = (ostream *)
                 std::ostream::operator<<
                           (local_398,((this->m_spec).atomicCounterCount + local_460) * 4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,") uniform atomic_uint counter",0x1d);
        uVar15 = ~uVar19 + (this->m_spec).atomicCounterCount;
        break;
      case OFFSETTYPE_FIRST_AUTO:
        if (uVar19 + 1 == (this->m_spec).atomicCounterCount) {
LAB_00401f08:
          pcVar18 = "layout(";
          if (bVar16 != 0) {
            pcVar18 = ", ";
          }
          lVar13 = 0x28;
          poVar9 = (ostream *)local_398;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,pcVar18,(ulong)(bVar16 ^ 1) * 5 + 2);
          pcVar18 = "offset=0) uniform atomic_uint counter0;\n";
        }
        else {
          if (uVar19 != 0) {
            if (bVar16 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
            }
            poVar9 = (ostream *)local_398;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"uniform atomic_uint counter",0x1b);
            uVar15 = uVar19 + 1;
            break;
          }
          pcVar18 = "layout(";
          if (bVar16 != 0) {
            pcVar18 = ", ";
          }
          lVar13 = 0x28;
          poVar9 = (ostream *)local_398;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,pcVar18,(ulong)(bVar16 ^ 1) * 5 + 2);
          pcVar18 = "offset=4) uniform atomic_uint counter1;\n";
        }
        goto LAB_004021aa;
      case OFFSETTYPE_DEFAULT_AUTO:
        if (uVar19 + 1 == (this->m_spec).atomicCounterCount) goto LAB_00401f08;
        if (bVar16 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
        }
        poVar9 = (ostream *)local_398;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"uniform atomic_uint counter",0x1b);
        uVar15 = uVar19 + 1;
        break;
      case OFFSETTYPE_RESET_DEFAULT:
        if (bVar16 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
        }
        if ((int)uVar19 < (this->m_spec).atomicCounterCount / 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"uniform atomic_uint counter",0x1b);
          iVar6 = (this->m_spec).atomicCounterCount / 2;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"uniform atomic_uint counter",0x1b);
          iVar6 = -((this->m_spec).atomicCounterCount / 2);
        }
        poVar9 = (ostream *)local_398;
        uVar15 = iVar6 + uVar19;
        break;
      case OFFSETTYPE_INVALID:
        pcVar18 = "layout(";
        if (bVar16 != 0) {
          pcVar18 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar18,(ulong)(bVar16 ^ 1) * 5 + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
        poVar9 = (ostream *)std::ostream::operator<<(local_398,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,") uniform atomic_uint counter",0x1d);
        break;
      case OFFSETTYPE_INVALID_OVERLAPPING:
        pcVar18 = "layout(";
        if (bVar16 != 0) {
          pcVar18 = ", ";
        }
        lVar13 = 0x25;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar18,(ulong)(bVar16 ^ 1) * 5 + 2);
        pcVar18 = "offset=0) uniform atomic_uint counter";
LAB_00402107:
        poVar9 = (ostream *)local_398;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar13);
        break;
      default:
        goto switchD_00401df4_default;
      }
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar15);
      lVar13 = 2;
      pcVar18 = ";\n";
LAB_004021aa:
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar13);
switchD_00401df4_default:
      uVar19 = uVar19 + 1;
      iVar6 = (this->m_spec).atomicCounterCount;
      iVar17 = iVar17 + 4;
      iVar24 = iVar24 + 2;
      local_460 = local_460 + -1;
    } while ((int)uVar19 < iVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"{\n",2);
  if (1 < (this->m_spec).callCount) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"\tfor (uint i = 0u; i < ",0x17);
    poVar9 = (ostream *)std::ostream::operator<<(local_398,(this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u; i++)\n",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,"\t\tuint id = (gl_GlobalInvocationID.x",0x24);
  if (1 < (this->m_spec).callCount) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398," * ",3);
    poVar9 = (ostream *)std::ostream::operator<<(local_398,(this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u",1);
  }
  iVar6 = (this->m_spec).callCount;
  pcVar18 = ")";
  if (1 < iVar6) {
    pcVar18 = " + i)";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,pcVar18,(ulong)(1 < iVar6) * 4 + 1);
  if (1 < (this->m_spec).atomicCounterCount) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398," * ",3);
    poVar9 = (ostream *)std::ostream::operator<<(local_398,(this->m_spec).atomicCounterCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,";\n",2);
  if (0 < (this->m_spec).atomicCounterCount) {
    iVar6 = 0;
    do {
      OVar12 = (this->m_spec).operations;
      if (OVar12 != OPERATION_GET && (OVar12 & OPERATION_GET) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\tsb_in.preGet[id + ",0x14);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = atomicCounter(counter",0x1a)
        ;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
      }
      bVar25 = (this->m_spec).useBranches;
      if ((bVar25 == true) && ((~(this->m_spec).operations & 3) == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
        iVar17 = (this->m_spec).callCount;
        pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (1 < iVar17) {
          pcVar18 = " + i";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar18,(ulong)(1 < iVar17) << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\t\tsb_in.increment[id + ",0x18);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"u] = atomicCounterIncrement(counter",0x23);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\t\t\tsb_in.decrement[id + ",0x18);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = uint(-1);\n",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t}\n",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\telse\n",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t{\n",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\t\t\tsb_in.decrement[id + ",0x18);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"u] = atomicCounterDecrement(counter",0x23);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") + 1u;\n",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\t\t\tsb_in.increment[id + ",0x18);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        lVar13 = 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = uint(-1);\n",0xf);
        pcVar18 = "\t\t}\n";
LAB_00402955:
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar13);
      }
      else {
        if (((this->m_spec).operations & OPERATION_INC) != 0) {
          if (bVar25 == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tsb_in.increment[id + ",0x17);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"u] = atomicCounterIncrement(counter",0x23);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            lVar13 = 3;
            pcVar18 = ");\n";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
            iVar17 = (this->m_spec).callCount;
            pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
            if (1 < iVar17) {
              pcVar18 = " + i";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,pcVar18,(ulong)(1 < iVar17) << 2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\t\tsb_in.increment[id + ",0x18);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"u] = atomicCounterIncrement(counter",0x23);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t}\n",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\telse\n",7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\t\t\tsb_in.increment[id + ",0x18);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            lVar13 = 4;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = uint(-1);\n",0xf);
            pcVar18 = "\t\t}\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar13);
        }
        if (((this->m_spec).operations & OPERATION_DEC) != 0) {
          if ((this->m_spec).useBranches == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
            iVar17 = (this->m_spec).callCount;
            pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
            if (1 < iVar17) {
              pcVar18 = " + i";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,pcVar18,(ulong)(1 < iVar17) << 2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\t\tsb_in.decrement[id + ",0x18);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"u] = atomicCounterDecrement(counter",0x23);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") + 1u;\n",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t}\n",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\telse\n",7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\t\t\tsb_in.decrement[id + ",0x18);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            lVar13 = 4;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = uint(-1);\n",0xf);
            pcVar18 = "\t\t}\n";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tsb_in.decrement[id + ",0x17);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"u] = atomicCounterDecrement(counter",0x23);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            lVar13 = 8;
            pcVar18 = ") + 1u;\n";
          }
          goto LAB_00402955;
        }
      }
      OVar12 = (this->m_spec).operations;
      if (OVar12 != OPERATION_GET && (OVar12 & OPERATION_GET) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\tsb_in.postGet[id + ",0x15);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = atomicCounter(counter",0x1a)
        ;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
      }
      if ((this->m_spec).operations == OPERATION_GET) {
        if ((this->m_spec).useBranches == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
          iVar17 = (this->m_spec).callCount;
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if (1 < iVar17) {
            pcVar18 = " + i";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,pcVar18,(ulong)(1 < iVar17) << 2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\t\tsb_in.get[id + ",0x12);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"u] = atomicCounter(counter",0x1a);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t}\n",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\telse\n",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t{\n",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t\tsb_in.get[id + ",0x12);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
          lVar13 = 4;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u] = uint(-1);\n",0xf);
          pcVar18 = "\t\t}\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\tsb_in.get[id + ",0x11);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"u] = atomicCounter(counter",0x1a);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
          lVar13 = 3;
          pcVar18 = ");\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar13);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < (this->m_spec).atomicCounterCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
  std::ios_base::~ios_base(local_328);
  local_3c8._0_4_ = 5;
  local_3c8._8_8_ = &local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_3c8 + 8),
             local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (ulong)(uint)local_3c8._0_4_ * 0x18),(value_type *)(local_3c8 + 8));
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._8_8_ != &local_3b0) {
    operator_delete((void *)local_3c8._8_8_,local_3b0._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar13 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  OVar12 = (this->m_spec).operations;
  iVar6 = 1;
  if (OVar12 != OPERATION_GET) {
    iVar6 = (OVar12 >> 1 & 2) + (OVar12 & OPERATION_INC) + (uint)((OVar12 >> 1 & 1) != 0);
  }
  iVar17 = (this->m_spec).atomicCounterCount;
  iVar24 = (this->m_spec).callCount;
  iVar20 = (this->m_spec).threadCount;
  glu::operator<<((TestLog *)&log->_M_allocated_capacity,&local_100);
  OVar1 = (this->m_spec).offsetType;
  if ((((OVar1 == OFFSETTYPE_INVALID) || (OVar1 == OFFSETTYPE_INVALID_DEFAULT)) ||
      (OVar1 == OFFSETTYPE_INVALID_OVERLAPPING)) ||
     ((this->m_spec).bindingType - BINDINGTYPE_INVALID < 2)) {
    if (local_100.m_program.m_info.linkOk == true) {
      local_398 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_390);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&puStack_390,"Expected program to fail, but compilation passed.",0x31);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_390);
      std::ios_base::~ios_base(local_320);
      pcVar18 = "Compile succeeded";
      goto LAB_00402d92;
    }
    local_398 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_390);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&puStack_390,"Compilation failed as expected.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_390);
    std::ios_base::~ios_base(local_320);
    pcVar18 = "Compile failed";
    testResult = QP_TEST_RESULT_PASS;
LAB_00402e04:
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar18);
    goto LAB_00402e0d;
  }
  if (local_100.m_program.m_info.linkOk == false) {
    local_398 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_390);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&puStack_390,"Compile failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_390);
    std::ios_base::~ios_base(local_320);
    pcVar18 = "Compile failed";
LAB_00402d92:
    testResult = QP_TEST_RESULT_FAIL;
    goto LAB_00402e04;
  }
  (**(code **)(lVar23 + 0x1680))(local_100.m_program.m_program);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3b7);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_208.m_object);
  iVar6 = iVar20 * iVar6 * iVar24 * iVar17 * 4;
  (**(code **)(lVar23 + 0x150))(0x90d2,(long)iVar6,0,0x88e4);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"Failed to create output buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3bc);
  local_1d8._0_4_ = (this->m_spec).threadCount * (this->m_spec).callCount + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
             (long)(this->m_spec).atomicCounterCount,(value_type_conflict2 *)local_1d8,
             (allocator_type *)local_3c8);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_1f0.m_object);
  (**(code **)(lVar23 + 0x150))(0x90d2,(long)(iVar17 << 2),local_398,0x88e4);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"Failed to create buffer for atomic counters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3c3);
  if (local_398 != (undefined1  [8])0x0) {
    operator_delete((void *)local_398,local_388[0]._M_allocated_capacity - (long)local_398);
  }
  (**(code **)(lVar23 + 0x48))(0x90d2,1,local_208.m_object);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"Failed to setup output buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3c8);
  (**(code **)(lVar23 + 0x48))(0x92c0,1,local_1f0.m_object);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"Failed to setup atomic counter buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3cc);
  (**(code **)(lVar23 + 0x528))((this->m_spec).threadCount,1,1);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3d0);
  (**(code **)(lVar23 + 0x648))();
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3d3);
  local_398._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3c8,(long)(iVar6 >> 2),
             (value_type_conflict2 *)local_398,(allocator_type *)local_1d8);
  local_398 = (undefined1  [8])((ulong)(uint)local_398._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_408,(long)(this->m_spec).atomicCounterCount,(value_type_conflict2 *)local_398,
             (allocator_type *)local_1d8);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_208.m_object);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3db);
  pvVar10 = (void *)(**(code **)(lVar23 + 0xd00))
                              (0x90d2,0,local_3c8._8_8_ - CONCAT44(local_3c8._4_4_,local_3c8._0_4_),
                               1);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3de);
  memcpy((void *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_),pvVar10,
         (local_3c8._8_8_ - (long)CONCAT44(local_3c8._4_4_,local_3c8._0_4_)) * 0x40000000 >> 0x1e);
  cVar5 = (**(code **)(lVar23 + 0x1670))(0x90d2);
  if (cVar5 == '\0') {
    dVar7 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar7,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                    ,0x3e4);
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Mapped buffer corrupted","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
               ,0x3e5);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar23 + 0x40))(0x90d2,0);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3e9);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_1f0.m_object);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3ef);
  pvVar10 = (void *)(**(code **)(lVar23 + 0xd00))
                              (0x90d2,0,(long)local_408.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_408.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,1);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3f2);
  memcpy(local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar10,
         ((long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start) * 0x40000000 >> 0x1e);
  cVar5 = (**(code **)(lVar23 + 0x1670))(0x90d2);
  if (cVar5 == '\0') {
    dVar7 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar7,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                    ,0x3f8);
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Mapped buffer corrupted","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
               ,0x3f9);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar23 + 0x40))(0x90d2,0);
  dVar7 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar7,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3fd);
  local_388[0]._M_allocated_capacity = (pointer)0x207265746e756f43;
  local_388[0]._8_4_ = 0x6f666e69;
  puStack_390 = (pointer)0xc;
  local_388[0]._M_local_buf[0xc] = '\0';
  local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x45;
  local_398 = (undefined1  [8])local_388;
  local_1d8._0_8_ = local_1c8;
  __dest = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::_M_create((ulong *)local_1d8,(ulong)&local_428);
  puVar4 = local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c8[0]._M_dataplus._M_p =
       (pointer)local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1d8._0_8_ = __dest;
  memcpy(__dest,"Show initial value, current value and expected value of each counter.",0x45);
  local_1d8._8_8_ = puVar4;
  *(undefined1 *)((long)&(__dest->_M_dataplus)._M_p + (long)puVar4) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_448,(TestLog *)&log->_M_allocated_capacity,
             (string *)local_398,(string *)local_1d8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
      local_1c8) {
    operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_dataplus._M_p + 1));
  }
  if (local_398 != (undefined1  [8])local_388) {
    operator_delete((void *)local_398,local_388[0]._M_allocated_capacity + 1);
  }
  if ((int)((ulong)((long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2) < 1) {
    uVar21 = (undefined4)CONCAT71((int7)((ulong)local_1c8 >> 8),1);
  }
  else {
    uVar21 = 1;
    lVar23 = 0;
    do {
      iVar6 = (this->m_spec).threadCount * (this->m_spec).callCount;
      uVar19 = iVar6 + 1;
      OVar12 = (this->m_spec).operations & (OPERATION_DEC|OPERATION_INC);
      uVar15 = 0xffffffff;
      if (OVar12 == OPERATION_INC) {
        iVar17 = iVar6;
        if ((this->m_spec).useBranches == true) {
          iVar17 = iVar6 - iVar6 / 2;
        }
        uVar15 = iVar17 + uVar19;
      }
      if (OVar12 == OPERATION_DEC) {
        iVar17 = iVar6;
        if ((this->m_spec).useBranches == true) {
          iVar17 = iVar6 - iVar6 / 2;
        }
        uVar15 = uVar19 - iVar17;
      }
      if (OVar12 == (OPERATION_DEC|OPERATION_INC)) {
        bVar25 = (this->m_spec).useBranches;
        iVar17 = 0;
        if (bVar25 == true) {
          iVar17 = iVar6 - iVar6 / 2;
        }
        iVar6 = -(iVar6 / 2);
        if (bVar25 == false) {
          iVar6 = 0;
        }
        uVar15 = iVar17 + uVar19 + iVar6;
      }
      uVar3 = local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar23];
      if (OVar12 == 0) {
        uVar15 = uVar19;
      }
      local_398 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_390);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&puStack_390,"atomic_uint counter",0x13);
      std::ostream::operator<<((ostringstream *)&puStack_390,(int)lVar23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&puStack_390," initial value: ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)&puStack_390);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&puStack_390,", value: ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)&puStack_390);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&puStack_390,", expected: ",0xc)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)&puStack_390);
      pcVar18 = ", failed!";
      if (uVar3 == uVar15) {
        pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&puStack_390,pcVar18,(ulong)(uVar3 != uVar15) * 9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_390);
      std::ios_base::~ios_base(local_320);
      if (uVar3 != uVar15) {
        uVar21 = 0;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < (int)((ulong)((long)local_408.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_408.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  tcu::TestLog::endSection
            ((TestLog *)
             local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_388[0]._M_allocated_capacity = (uint *)0x0;
  local_398 = (undefined1  [8])0x0;
  local_1c8[0]._M_dataplus._M_p = (pointer)0x0;
  local_1d8._0_8_ = (pointer)0x0;
  local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puStack_390 = (uint *)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  iVar6 = (this->m_spec).threadCount;
  OVar12 = (this->m_spec).operations;
  local_210 = (ulong)OVar12;
  bVar25 = true;
  iVar17 = -1;
  local_460 = -1;
  if ((OVar12 == OPERATION_GET) || (6 < OVar12 - OPERATION_INC)) goto switchD_00403a5d_caseD_4;
  iVar20 = (this->m_spec).callCount * iVar6 * (this->m_spec).atomicCounterCount;
  iVar24 = 0;
  switch(OVar12) {
  case OPERATION_INC:
    iVar22 = -1;
    iVar24 = 0;
    bVar25 = true;
    break;
  case OPERATION_DEC:
    iVar17 = 0;
  case OPERATION_GET:
switchD_00403a5d_caseD_4:
    iVar22 = -1;
    iVar24 = -1;
    local_460 = iVar17;
    break;
  case OPERATION_DEC|OPERATION_INC:
    iVar22 = -1;
    local_460 = iVar20;
    break;
  case OPERATION_GET|OPERATION_INC:
    iVar22 = iVar20 * 2;
    goto LAB_00403a92;
  case OPERATION_GET|OPERATION_DEC:
    iVar22 = iVar20 * 2;
    bVar25 = false;
    iVar24 = -1;
    local_460 = iVar20;
    break;
  case OPERATION_GET|OPERATION_DEC|OPERATION_INC:
    iVar17 = iVar20 * 2;
    iVar22 = iVar20 * 3;
LAB_00403a92:
    iVar24 = iVar20;
    local_460 = iVar17;
    bVar25 = false;
  }
  local_39c = uVar21;
  if (0 < iVar6) {
    local_470 = 0;
    do {
      if (0 < (this->m_spec).callCount) {
        iVar6 = 0;
        do {
          iVar17 = (this->m_spec).atomicCounterCount;
          if (0 < iVar17) {
            iVar20 = 0;
            do {
              iVar17 = ((this->m_spec).callCount * local_470 + iVar6) * iVar17;
              if (iVar24 != -1) {
                puVar14 = (uint *)((long)(iVar20 + iVar24 + iVar17) * 4 +
                                  CONCAT44(local_3c8._4_4_,local_3c8._0_4_));
                if (puStack_390 == (pointer)local_388[0]._0_8_) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_398,
                             (iterator)puStack_390,puVar14);
                }
                else {
                  *puStack_390 = *puVar14;
                  puStack_390 = puStack_390 + 1;
                }
              }
              if (local_460 != -1) {
                puVar14 = (uint *)((long)(local_460 + iVar20 + iVar17) * 4 +
                                  CONCAT44(local_3c8._4_4_,local_3c8._0_4_));
                if ((pointer)local_1d8._8_8_ == local_1c8[0]._M_dataplus._M_p) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1d8,
                             (iterator)local_1d8._8_8_,puVar14);
                }
                else {
                  *(uint *)local_1d8._8_8_ = *puVar14;
                  local_1d8._8_8_ = local_1d8._8_8_ + 4;
                }
              }
              if (!bVar25) {
                puVar14 = (uint *)((long)(iVar20 + iVar17) * 4 +
                                  CONCAT44(local_3c8._4_4_,local_3c8._0_4_));
                if (local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_428,
                             (iterator)
                             local_428.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar14);
                }
                else {
                  *local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *puVar14;
                  local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (iVar22 != -1) {
                puVar14 = (uint *)((long)(iVar17 + iVar22 + iVar20) * 4 +
                                  CONCAT44(local_3c8._4_4_,local_3c8._0_4_));
                if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_448,
                             (iterator)
                             local_448.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar14);
                }
                else {
                  *local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *puVar14;
                  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if ((int)local_210 == 4) {
                puVar14 = (uint *)((long)(iVar20 + iVar17) * 4 +
                                  CONCAT44(local_3c8._4_4_,local_3c8._0_4_));
                if (local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_3e8,
                             (iterator)
                             local_3e8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar14);
                }
                else {
                  *local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *puVar14;
                  local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              iVar20 = iVar20 + 1;
              iVar17 = (this->m_spec).atomicCounterCount;
            } while (iVar20 < iVar17);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < (this->m_spec).callCount);
      }
      local_470 = local_470 + 1;
    } while (local_470 < (this->m_spec).threadCount);
  }
  bVar25 = checkAndLogCallValues
                     (this,(TestLog *)&log->_M_allocated_capacity,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_428,
                      &local_448,&local_3e8);
  uVar21 = local_39c;
  if (local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8[0]._M_dataplus._M_p - local_1d8._0_8_);
  }
  bVar16 = bVar25 & (byte)uVar21;
  if (local_398 != (undefined1  [8])0x0) {
    operator_delete((void *)local_398,local_388[0]._M_allocated_capacity - (long)local_398);
  }
  pcVar18 = "Fail";
  if (bVar16 != 0) {
    pcVar18 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar16 ^ 1),
             pcVar18);
  if (local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar10 = (void *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,(long)local_3b8 - (long)pvVar10);
  }
LAB_00402e0d:
  glu::ShaderProgram::~ShaderProgram(&local_100);
  glu::ObjectWrapper::~ObjectWrapper(&local_208);
  glu::ObjectWrapper::~ObjectWrapper(&local_1f0);
  return STOP;
}

Assistant:

TestCase::IterateResult AtomicCounterTest::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const glu::Buffer			counterBuffer		(m_context.getRenderContext());
	const glu::Buffer			outputBuffer		(m_context.getRenderContext());
	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(glu::SHADERTYPE_COMPUTE, generateShaderSource(m_spec)));

	const deInt32				counterBufferSize	= m_spec.atomicCounterCount * 4;
	const deInt32				ssoSize				= m_spec.atomicCounterCount * m_spec.callCount * m_spec.threadCount * 4 * getOperationCount();

	log << program;

	if (m_spec.offsetType == OFFSETTYPE_INVALID || m_spec.offsetType == OFFSETTYPE_INVALID_DEFAULT || m_spec.bindingType == BINDINGTYPE_INVALID || m_spec.bindingType == BINDINGTYPE_INVALID_DEFAULT || m_spec.offsetType == OFFSETTYPE_INVALID_OVERLAPPING)
	{
		if (program.isOk())
		{
			log << TestLog::Message << "Expected program to fail, but compilation passed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile succeeded");
			return STOP;
		}
		else
		{
			log << TestLog::Message << "Compilation failed as expected." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Compile failed");
			return STOP;
		}
	}
	else if (!program.isOk())
	{
		log << TestLog::Message << "Compile failed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Create output buffer
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssoSize, NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create output buffer");

	// Create atomic counter buffer
	{
		vector<deUint32> data(m_spec.atomicCounterCount, getInitialValue());
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, counterBufferSize, &(data[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create buffer for atomic counters");
	}

	// Bind output buffer
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup output buffer");

	// Bind atomic counter buffer
	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, *counterBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup atomic counter buffer");

	// Dispath compute
	gl.dispatchCompute(m_spec.threadCount, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

	gl.finish();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

	vector<deUint32> output(ssoSize/4, 0);
	vector<deUint32> counters(m_spec.atomicCounterCount, 0);

	// Read back output buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(output.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(output[0]), ptr, (int)output.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	// Read back counter buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(counters.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(counters[0]), ptr, (int)counters.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	bool isOk = true;

	if (!checkAndLogCounterValues(log, counters))
		isOk = false;

	{
		vector<deUint32> increments;
		vector<deUint32> decrements;
		vector<deUint32> preGets;
		vector<deUint32> postGets;
		vector<deUint32> gets;

		splitBuffer(output, increments, decrements, preGets, postGets, gets);

		if (!checkAndLogCallValues(log, increments, decrements, preGets, postGets, gets))
			isOk = false;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}